

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_xc_otpss_d.c
# Opt level: O2

void mgga_xc_otpss_d_init(xc_func_type *p)

{
  xc_mix_init(p,2,mgga_xc_otpss_d_init::funcs_id,mgga_xc_otpss_d_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,mgga_xc_otpss_d_init::par_x_tpss);
  xc_func_set_ext_params(p->func_aux[1],mgga_xc_otpss_d_init::par_c_tpss);
  return;
}

Assistant:

static void
mgga_xc_otpss_d_init(xc_func_type *p)
{
  static int   funcs_id  [2] = {XC_MGGA_X_TPSS, XC_MGGA_C_TPSS};
  static double funcs_coef[2] = {1.0, 1.0};

  static double par_x_tpss[] = {3.43, 0.75896, 0.165, 0.778, 0.41567, 2.0, 0.0};
  static double par_c_tpss[] = {0.08861, 0.7, 0.59, 0.9269, 0.6225, 2.1540};

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_func_set_ext_params(p->func_aux[0], par_x_tpss);
  xc_func_set_ext_params(p->func_aux[1], par_c_tpss);
}